

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<BezierEase::SingleCubicBezier>::QList
          (QList<BezierEase::SingleCubicBezier> *this,qsizetype size)

{
  QArrayDataPointer<BezierEase::SingleCubicBezier> *in_RSI;
  QArrayDataPointer<BezierEase::SingleCubicBezier> *in_RDI;
  QArrayDataPointer<BezierEase::SingleCubicBezier> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  AllocationOption in_stack_ffffffffffffffec;
  
  QArrayDataPointer<BezierEase::SingleCubicBezier>::QArrayDataPointer
            (unaff_retaddr,(qsizetype)in_RDI,(qsizetype)in_RSI,in_stack_ffffffffffffffec);
  if (in_RSI != (QArrayDataPointer<BezierEase::SingleCubicBezier> *)0x0) {
    QArrayDataPointer<BezierEase::SingleCubicBezier>::operator->(in_RDI);
    QArrayDataPointer<BezierEase::SingleCubicBezier>::appendInitialize
              (in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }